

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall ResponseDsl::~ResponseDsl(ResponseDsl *this)

{
  ResponseDsl *this_local;
  
  httpparser::Response::~Response(&this->response);
  return;
}

Assistant:

ResponseDsl &statusCode(unsigned int statusCode)
    {
        response.statusCode = statusCode;
        return *this;
    }